

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O3

UBool __thiscall icu_63::VTimeZone::operator==(VTimeZone *this,TimeZone *that)

{
  ushort uVar1;
  char16_t cVar2;
  char *__s1;
  char *__s2;
  UBool UVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  
  if (this == (VTimeZone *)that) {
    return '\x01';
  }
  __s1 = *(char **)((this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[-1] + 8);
  __s2 = *(char **)((that->super_UObject)._vptr_UObject[-1] + 8);
  if ((((__s1 == __s2) || ((*__s1 != '*' && (iVar4 = strcmp(__s1,__s2), iVar4 == 0)))) &&
      (UVar3 = TimeZone::operator==((TimeZone *)this,that), UVar3 != '\0')) &&
     (iVar4 = (*(this->tz->super_TimeZone).super_UObject._vptr_UObject[3])
                        (this->tz,that[1].super_UObject._vptr_UObject), (char)iVar4 != '\0')) {
    uVar1 = (this->tzurl).fUnion.fStackFields.fLengthAndFlags;
    if ((uVar1 & 1) == 0) {
      if ((short)uVar1 < 0) {
        iVar4 = (this->tzurl).fUnion.fFields.fLength;
      }
      else {
        iVar4 = (int)(short)uVar1 >> 5;
      }
      cVar2 = that[1].fID.fUnion.fStackFields.fBuffer[3];
      if (cVar2 < L'\0') {
        iVar5 = *(int *)((long)&that[1].fID.fUnion + 0xc);
      }
      else {
        iVar5 = (int)cVar2 >> 5;
      }
      if (((int)cVar2 & 1U) != 0) {
        return '\0';
      }
      if (iVar4 != iVar5) {
        return '\0';
      }
      UVar3 = UnicodeString::doEquals
                        (&this->tzurl,(UnicodeString *)&that[1].fID.fUnion.fStackFields,iVar4);
      bVar6 = UVar3 != '\0';
    }
    else {
      bVar6 = (bool)(*(byte *)((long)&that[1].fID.fUnion + 8) & 1);
    }
    if (bVar6 != false) {
      if ((this->lastmod == (double)that[2].fID.super_Replaceable.super_UObject._vptr_UObject) &&
         (!NAN(this->lastmod) &&
          !NAN((double)that[2].fID.super_Replaceable.super_UObject._vptr_UObject))) {
        return '\x01';
      }
    }
  }
  return '\0';
}

Assistant:

UBool
VTimeZone::operator==(const TimeZone& that) const {
    if (this == &that) {
        return TRUE;
    }
    if (typeid(*this) != typeid(that) || !BasicTimeZone::operator==(that)) {
        return FALSE;
    }
    VTimeZone *vtz = (VTimeZone*)&that;
    if (*tz == *(vtz->tz)
        && tzurl == vtz->tzurl
        && lastmod == vtz->lastmod
        /* && olsonzid = that.olsonzid */
        /* && icutzver = that.icutzver */) {
        return TRUE;
    }
    return FALSE;
}